

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKbo.cpp
# Opt level: O1

tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *
Kernel::toNumeralMul
          (tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>
           *__return_storage_ptr__,TermList t)

{
  uint uVar1;
  ulong uVar2;
  Value VVar3;
  Symbol *pSVar4;
  bool bVar5;
  uint uVar6;
  TermList TVar7;
  TermList TVar8;
  RationalConstantType RStack_178;
  tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> local_158;
  undefined1 local_128 [8];
  undefined1 auStack_120 [24];
  undefined1 local_108;
  undefined7 uStack_107;
  Value aVStack_100 [3];
  RationalConstantType local_e8;
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [56];
  OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_> local_88;
  RealConstantType local_50;
  
  if ((t._content & 1) == 0) {
    uVar1 = *(uint *)(t._content + 8);
    TVar7 = SortHelper::getResultSort(t._content);
    TVar8 = AtomicSort::intSort();
    if (TVar7._content == TVar8._content) {
      uVar6 = NumTraits<Kernel::IntegerConstantType>::mulF();
      if (((uVar1 == uVar6) &&
          (uVar2 = *(ulong *)(t._content + 0x28 +
                             (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8), (uVar2 & 3) == 0
          )) && (bVar5 = Signature::Symbol::numeralConstant
                                   (*(Symbol **)
                                     (*(long *)(DAT_00b7e1b0 + 0x60) +
                                     (ulong)*(uint *)(uVar2 + 8) * 8),(IntegerConstantType *)0x0),
                bVar5)) {
        VVar3 = *(Value *)(t._content + 0x20 + (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8)
        ;
        pSVar4 = *(Symbol **)
                  (*(long *)(DAT_00b7e1b0 + 0x60) +
                  (ulong)*(uint *)(*(long *)(t._content + 0x28 +
                                            (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8) +
                                  8) * 8);
        Signature::Symbol::numeralConstant(pSVar4,(IntegerConstantType *)0x0);
        IntegerConstantType::IntegerConstantType
                  (&RStack_178._num,(IntegerConstantType *)(pSVar4 + 1));
        rat((RationalConstantType *)&local_158,&RStack_178._num);
        std::_Head_base<1UL,_Kernel::RationalConstantType,_false>::
        _Head_base<Kernel::RationalConstantType>
                  ((_Head_base<1UL,_Kernel::RationalConstantType,_false> *)local_128,
                   (RationalConstantType *)&local_158);
        local_108 = 1;
        aVStack_100[0] = VVar3;
        ::Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>
        ::OptionBase(&local_88,
                     (tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *)local_128
                    );
        mpz_clear((__mpz_struct *)(auStack_120 + 8));
        mpz_clear((__mpz_struct *)local_128);
        mpz_clear(local_158.
                  super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>
                  .super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
                  super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._den._val)
        ;
        mpz_clear((__mpz_struct *)&local_158);
        mpz_clear((__mpz_struct *)&RStack_178);
      }
      else if (((t._content & 2) == 0) &&
              (bVar5 = Signature::Symbol::numeralConstant
                                 (*(Symbol **)
                                   (*(long *)(DAT_00b7e1b0 + 0x60) +
                                   (ulong)*(uint *)(t._content + 8) * 8),(IntegerConstantType *)0x0)
              , bVar5)) {
        pSVar4 = *(Symbol **)(*(long *)(DAT_00b7e1b0 + 0x60) + (ulong)*(uint *)(t._content + 8) * 8)
        ;
        Signature::Symbol::numeralConstant(pSVar4,(IntegerConstantType *)0x0);
        IntegerConstantType::IntegerConstantType
                  (&RStack_178._num,(IntegerConstantType *)(pSVar4 + 1));
        rat((RationalConstantType *)&local_158,&RStack_178._num);
        std::_Head_base<1UL,_Kernel::RationalConstantType,_false>::
        _Head_base<Kernel::RationalConstantType>
                  ((_Head_base<1UL,_Kernel::RationalConstantType,_false> *)local_128,
                   (RationalConstantType *)&local_158);
        _local_108 = _local_108 & 0xffffffffffffff00;
        ::Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>
        ::OptionBase(&local_88,
                     (tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *)local_128
                    );
        mpz_clear((__mpz_struct *)(auStack_120 + 8));
        mpz_clear((__mpz_struct *)local_128);
        mpz_clear(local_158.
                  super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>
                  .super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
                  super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._den._val)
        ;
        mpz_clear((__mpz_struct *)&local_158);
        mpz_clear((__mpz_struct *)&RStack_178);
      }
      else {
        RationalConstantType::RationalConstantType((RationalConstantType *)&local_158,1);
        std::_Head_base<1UL,_Kernel::RationalConstantType,_false>::
        _Head_base<Kernel::RationalConstantType>
                  ((_Head_base<1UL,_Kernel::RationalConstantType,_false> *)local_128,
                   (RationalConstantType *)&local_158);
        local_108 = 1;
        aVStack_100[0] = (Value)t._content;
        ::Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>
        ::OptionBase(&local_88,
                     (tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *)local_128
                    );
        mpz_clear((__mpz_struct *)(auStack_120 + 8));
        mpz_clear((__mpz_struct *)local_128);
        mpz_clear(local_158.
                  super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>
                  .super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
                  super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._den._val)
        ;
        mpz_clear((__mpz_struct *)&local_158);
      }
    }
    else {
      local_88._elem._elem.init.
      super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
      super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
      super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._den._val[0]._mp_d =
           (mp_limb_t *)0x0;
      local_88._elem._elem._32_8_ = 0;
      local_88._elem._elem.init.
      super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
      super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
      super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._num._val[0]._mp_d =
           (mp_limb_t *)0x0;
      local_88._elem._elem._16_8_ = 0;
      local_88._isSome = false;
      local_88._1_7_ = 0;
      local_88._elem._elem._0_8_ = 0;
      local_88._elem._elem.init.
      super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
      super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
      super_OptionBase<Kernel::TermList>._elem._elem = (MaybeUninit<Kernel::TermList>)(Value)0x0;
    }
    if (local_88._isSome == true) {
      local_128[0] = true;
      std::_Head_base<1UL,_Kernel::RationalConstantType,_false>::_Head_base
                ((_Head_base<1UL,_Kernel::RationalConstantType,_false> *)auStack_120,
                 (_Head_base<1UL,_Kernel::RationalConstantType,_false> *)&local_88._elem);
      aVStack_100[0].init._content._0_1_ =
           local_88._elem._elem.init.
           super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
           super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
           super_OptionBase<Kernel::TermList>._isSome;
      if (local_88._elem._elem.init.
          super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
          super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
          super_OptionBase<Kernel::TermList>._isSome == true) {
        aVStack_100[1] =
             (Value)local_88._elem._elem.init.
                    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>
                    .super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
                    super_OptionBase<Kernel::TermList>._elem._elem;
      }
    }
    else {
      TVar8 = AtomicSort::rationalSort();
      if (TVar7._content == TVar8._content) {
        uVar6 = NumTraits<Kernel::RationalConstantType>::mulF();
        if (((uVar1 == uVar6) &&
            (uVar2 = *(ulong *)(t._content + 0x28 +
                               (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8),
            (uVar2 & 3) == 0)) &&
           (bVar5 = Signature::Symbol::numeralConstant
                              (*(Symbol **)
                                (*(long *)(DAT_00b7e1b0 + 0x60) + (ulong)*(uint *)(uVar2 + 8) * 8),
                               (RationalConstantType *)0x0), bVar5)) {
          VVar3 = *(Value *)(t._content + 0x20 +
                            (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8);
          pSVar4 = *(Symbol **)
                    (*(long *)(DAT_00b7e1b0 + 0x60) +
                    (ulong)*(uint *)(*(long *)(t._content + 0x28 +
                                              (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8)
                                    + 8) * 8);
          Signature::Symbol::numeralConstant(pSVar4,(RationalConstantType *)0x0);
          IntegerConstantType::IntegerConstantType
                    (&local_e8._num,(IntegerConstantType *)(pSVar4 + 1));
          IntegerConstantType::IntegerConstantType
                    (&local_e8._den,(IntegerConstantType *)&pSVar4[1]._name.field_2);
          rat<Kernel::RationalConstantType>(&RStack_178,&local_e8);
          std::_Head_base<1UL,_Kernel::RationalConstantType,_false>::
          _Head_base<Kernel::RationalConstantType>
                    ((_Head_base<1UL,_Kernel::RationalConstantType,_false> *)&local_158,&RStack_178)
          ;
          local_158.
          super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
          super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
          super_OptionBase<Kernel::TermList>._isSome = true;
          local_158.
          super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
          super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
          super_OptionBase<Kernel::TermList>._elem._elem = VVar3;
          ::Lib::
          OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
          OptionBase((OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>
                      *)local_128,&local_158);
          mpz_clear(local_158.
                    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>
                    .super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
                    super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._den.
                    _val);
          mpz_clear((__mpz_struct *)&local_158);
          mpz_clear(RStack_178._den._val);
          mpz_clear((__mpz_struct *)&RStack_178);
          mpz_clear(local_e8._den._val);
          mpz_clear((__mpz_struct *)&local_e8);
        }
        else if (((t._content & 2) == 0) &&
                (bVar5 = Signature::Symbol::numeralConstant
                                   (*(Symbol **)
                                     (*(long *)(DAT_00b7e1b0 + 0x60) +
                                     (ulong)*(uint *)(t._content + 8) * 8),
                                    (RationalConstantType *)0x0), bVar5)) {
          pSVar4 = *(Symbol **)
                    (*(long *)(DAT_00b7e1b0 + 0x60) + (ulong)*(uint *)(t._content + 8) * 8);
          Signature::Symbol::numeralConstant(pSVar4,(RationalConstantType *)0x0);
          IntegerConstantType::IntegerConstantType
                    (&local_e8._num,(IntegerConstantType *)(pSVar4 + 1));
          IntegerConstantType::IntegerConstantType
                    (&local_e8._den,(IntegerConstantType *)&pSVar4[1]._name.field_2);
          rat<Kernel::RationalConstantType>(&RStack_178,&local_e8);
          std::_Head_base<1UL,_Kernel::RationalConstantType,_false>::
          _Head_base<Kernel::RationalConstantType>
                    ((_Head_base<1UL,_Kernel::RationalConstantType,_false> *)&local_158,&RStack_178)
          ;
          local_158.
          super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
          super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
          super_OptionBase<Kernel::TermList>._isSome = false;
          ::Lib::
          OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
          OptionBase((OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>
                      *)local_128,&local_158);
          mpz_clear(local_158.
                    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>
                    .super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
                    super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._den.
                    _val);
          mpz_clear((__mpz_struct *)&local_158);
          mpz_clear(RStack_178._den._val);
          mpz_clear((__mpz_struct *)&RStack_178);
          mpz_clear(local_e8._den._val);
          mpz_clear((__mpz_struct *)&local_e8);
        }
        else {
          RationalConstantType::RationalConstantType(&RStack_178,1);
          std::_Head_base<1UL,_Kernel::RationalConstantType,_false>::
          _Head_base<Kernel::RationalConstantType>
                    ((_Head_base<1UL,_Kernel::RationalConstantType,_false> *)&local_158,&RStack_178)
          ;
          local_158.
          super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
          super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
          super_OptionBase<Kernel::TermList>._isSome = true;
          local_158.
          super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
          super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
          super_OptionBase<Kernel::TermList>._elem._elem = (Value)t._content;
          ::Lib::
          OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
          OptionBase((OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>
                      *)local_128,&local_158);
          mpz_clear(local_158.
                    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>
                    .super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
                    super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._den.
                    _val);
          mpz_clear((__mpz_struct *)&local_158);
          mpz_clear(RStack_178._den._val);
          mpz_clear((__mpz_struct *)&RStack_178);
        }
      }
      else {
        _local_108 = (mp_limb_t *)0x0;
        aVStack_100[0] = (Value)0x0;
        auStack_120._8_8_ = (mp_limb_t *)0x0;
        auStack_120._16_8_ = (mp_limb_t *)0x0;
        local_128 = (undefined1  [8])0x0;
        auStack_120._0_8_ = (mp_limb_t *)0x0;
        aVStack_100[1] = (Value)0x0;
      }
    }
    if ((bool)local_128[0] == true) {
      local_c8[0] = true;
      std::_Head_base<1UL,_Kernel::RationalConstantType,_false>::_Head_base
                ((_Head_base<1UL,_Kernel::RationalConstantType,_false> *)auStack_c0,
                 (_Head_base<1UL,_Kernel::RationalConstantType,_false> *)auStack_120);
      auStack_c0[0x20] = (undefined1)aVStack_100[0].init._content;
      if ((undefined1)aVStack_100[0].init._content == '\x01') {
        auStack_c0._40_8_ = aVStack_100[1];
      }
    }
    else {
      TVar8 = AtomicSort::realSort();
      if (TVar7._content == TVar8._content) {
        uVar6 = NumTraits<Kernel::RealConstantType>::mulF();
        if (((uVar1 == uVar6) &&
            (uVar2 = *(ulong *)(t._content + 0x28 +
                               (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8),
            (uVar2 & 3) == 0)) &&
           (bVar5 = Signature::Symbol::numeralConstant
                              (*(Symbol **)
                                (*(long *)(DAT_00b7e1b0 + 0x60) + (ulong)*(uint *)(uVar2 + 8) * 8),
                               (RealConstantType *)0x0), bVar5)) {
          VVar3 = *(Value *)(t._content + 0x20 +
                            (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8);
          pSVar4 = *(Symbol **)
                    (*(long *)(DAT_00b7e1b0 + 0x60) +
                    (ulong)*(uint *)(*(long *)(t._content + 0x28 +
                                              (ulong)(*(uint *)(t._content + 0xc) & 0xfffffff) * 8)
                                    + 8) * 8);
          Signature::Symbol::numeralConstant(pSVar4,(RealConstantType *)0x0);
          RealConstantType::RealConstantType
                    ((RealConstantType *)&local_e8,(RealConstantType *)(pSVar4 + 1));
          rat<Kernel::RealConstantType>(&RStack_178,(RealConstantType *)&local_e8);
          std::_Head_base<1UL,_Kernel::RationalConstantType,_false>::
          _Head_base<Kernel::RationalConstantType>
                    ((_Head_base<1UL,_Kernel::RationalConstantType,_false> *)&local_158,&RStack_178)
          ;
          local_158.
          super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
          super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
          super_OptionBase<Kernel::TermList>._isSome = true;
          local_158.
          super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
          super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
          super_OptionBase<Kernel::TermList>._elem._elem = VVar3;
          ::Lib::
          OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
          OptionBase((OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>
                      *)local_c8,&local_158);
          mpz_clear(local_158.
                    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>
                    .super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
                    super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._den.
                    _val);
          mpz_clear((__mpz_struct *)&local_158);
          mpz_clear(RStack_178._den._val);
          mpz_clear((__mpz_struct *)&RStack_178);
          mpz_clear(local_e8._den._val);
          mpz_clear((__mpz_struct *)&local_e8);
        }
        else if (((t._content & 2) == 0) &&
                (bVar5 = Signature::Symbol::numeralConstant
                                   (*(Symbol **)
                                     (*(long *)(DAT_00b7e1b0 + 0x60) +
                                     (ulong)*(uint *)(t._content + 8) * 8),(RealConstantType *)0x0),
                bVar5)) {
          pSVar4 = *(Symbol **)
                    (*(long *)(DAT_00b7e1b0 + 0x60) + (ulong)*(uint *)(t._content + 8) * 8);
          Signature::Symbol::numeralConstant(pSVar4,(RealConstantType *)0x0);
          RealConstantType::RealConstantType(&local_50,(RealConstantType *)(pSVar4 + 1));
          rat<Kernel::RealConstantType>(&RStack_178,&local_50);
          std::_Head_base<1UL,_Kernel::RationalConstantType,_false>::
          _Head_base<Kernel::RationalConstantType>
                    ((_Head_base<1UL,_Kernel::RationalConstantType,_false> *)&local_158,&RStack_178)
          ;
          local_158.
          super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
          super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
          super_OptionBase<Kernel::TermList>._isSome = false;
          ::Lib::
          OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
          OptionBase((OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>
                      *)local_c8,&local_158);
          mpz_clear(local_158.
                    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>
                    .super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
                    super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._den.
                    _val);
          mpz_clear((__mpz_struct *)&local_158);
          mpz_clear(RStack_178._den._val);
          mpz_clear((__mpz_struct *)&RStack_178);
          mpz_clear(local_50.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_50);
        }
        else {
          RationalConstantType::RationalConstantType(&RStack_178,1);
          std::_Head_base<1UL,_Kernel::RationalConstantType,_false>::
          _Head_base<Kernel::RationalConstantType>
                    ((_Head_base<1UL,_Kernel::RationalConstantType,_false> *)&local_158,&RStack_178)
          ;
          local_158.
          super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
          super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
          super_OptionBase<Kernel::TermList>._isSome = true;
          local_158.
          super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>.
          super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
          super_OptionBase<Kernel::TermList>._elem._elem = (Value)t._content;
          ::Lib::
          OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
          OptionBase((OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>
                      *)local_c8,&local_158);
          mpz_clear(local_158.
                    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>
                    .super__Tuple_impl<1UL,_Kernel::RationalConstantType>.
                    super__Head_base<1UL,_Kernel::RationalConstantType,_false>._M_head_impl._den.
                    _val);
          mpz_clear((__mpz_struct *)&local_158);
          mpz_clear(RStack_178._den._val);
          mpz_clear((__mpz_struct *)&RStack_178);
        }
      }
      else {
        auStack_c0._24_8_ = (mp_limb_t *)0x0;
        auStack_c0._32_8_ = 0;
        auStack_c0._8_8_ = (mp_limb_t *)0x0;
        auStack_c0._16_4_ = 0;
        auStack_c0._20_4_ = 0;
        local_c8 = (undefined1  [8])0x0;
        auStack_c0._0_4_ = 0;
        auStack_c0._4_4_ = 0;
        auStack_c0._40_8_ = (Value)0x0;
      }
    }
    ::Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
    ~OptionBase((OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>
                 *)local_128);
    ::Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
    ~OptionBase(&local_88);
    std::_Head_base<1UL,_Kernel::RationalConstantType,_false>::_Head_base
              ((_Head_base<1UL,_Kernel::RationalConstantType,_false> *)__return_storage_ptr__,
               (_Head_base<1UL,_Kernel::RationalConstantType,_false> *)auStack_c0);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>).
    super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
    super_OptionBase<Kernel::TermList>._isSome = (bool)auStack_c0[0x20];
    if ((bool)auStack_c0[0x20] == true) {
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>).
      super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
      super_OptionBase<Kernel::TermList>._elem._elem = (Value)auStack_c0._40_8_;
    }
    ::Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
    ~OptionBase((OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>
                 *)local_c8);
    return __return_storage_ptr__;
  }
  rat((RationalConstantType *)local_128,1);
  std::_Head_base<1UL,_Kernel::RationalConstantType,_false>::
  _Head_base<Kernel::RationalConstantType>
            ((_Head_base<1UL,_Kernel::RationalConstantType,_false> *)__return_storage_ptr__,
             (RationalConstantType *)local_128);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>).
  super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
  super_OptionBase<Kernel::TermList>._isSome = true;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>).
  super__Head_base<0UL,_Lib::Option<Kernel::TermList>,_false>._M_head_impl.
  super_OptionBase<Kernel::TermList>._elem._elem.init._content = t._content;
  mpz_clear((__mpz_struct *)(auStack_120 + 8));
  mpz_clear((__mpz_struct *)local_128);
  return __return_storage_ptr__;
}

Assistant:

auto toNumeralMul(TermList t) -> std::tuple<Option<TermList>, RationalConstantType> {
  if (t.isVar()) {
    return std::make_tuple(Option<TermList>(t), rat(1));
  } else {
    auto term = t.term();
    auto f = term->functor();
    auto sort = SortHelper::getResultSort(term);
    return tryNumTraits([&](auto numTraits) {
        if (sort != numTraits.sort()) {
          return Option<std::tuple<Option<TermList>, RationalConstantType>>();

        } else if (f == numTraits.mulF() && numTraits.isNumeral(*term->nthArgument(0))) {
          /* t = k * t' ( for some numeral k ) */
          return some(std::make_tuple(
                some(*term->nthArgument(1)),  /* <- t' */
                rat(numTraits.tryNumeral(*term->nthArgument(0)).unwrap()) /* <- k */
                ));

        } else if (numTraits.isNumeral(t)) {
          /* t is a numeral */
          return some(std::make_tuple(
                Option<TermList>(), 
                rat(numTraits.tryNumeral(t).unwrap())
                ));

        } else {
          /* t is uninterpreted */
          return some(std::make_tuple(Option<TermList>(t), RationalConstantType(1)));
        }
    }).unwrap();
  }
}